

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationLimitTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationLimitTest *this,GLuint test_case_index)

{
  GLchar *pGVar1;
  size_t sVar2;
  char *pcVar3;
  pointer ptVar4;
  stringstream stream;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar4 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start + test_case_index;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Stage: ",7);
  pGVar1 = Utils::Shader::GetStageName(ptVar4->m_stage);
  sVar2 = strlen(pGVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar1,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," type: ",7);
  pGVar1 = Utils::Type::GetGLSLTypeName(&ptVar4->m_type);
  if (pGVar1 == (GLchar *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(pGVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", direction: ",0xd);
  pcVar3 = "output";
  if ((ulong)ptVar4->m_is_input != 0) {
    pcVar3 = "input";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,pcVar3,6 - (ulong)ptVar4->m_is_input);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationLimitTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << " type: " << test_case.m_type.GetGLSLTypeName() << ", direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	return stream.str();
}